

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

int rebalance(vmd_bst_t *tree,vmd_bst_node_t *node)

{
  char cVar1;
  vmd_bst_node_t *node_00;
  vmd_bst_node_t *node_01;
  bool bVar2;
  char cVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  char cVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  char cVar11;
  vmd_bst_node_t *node_02;
  
  bVar6 = node->field_0x20;
  cVar11 = bVar6 << 5;
  iVar8 = 0;
  if (2 < (byte)((cVar11 >> 5) + 1U)) {
    cVar7 = bVar6 << 5;
    bVar2 = cVar7 < '\x01';
    node_00 = node->child[bVar2];
    cVar1 = node_00->field_0x20;
    cVar3 = cVar1 << 5;
    bVar4 = '\0' < cVar3 == '\0' < cVar7;
    if (bVar4 || cVar3 == '\0') {
      uVar9 = (ulong)('\0' < (char)(bVar6 << 5));
      node_02 = node_00;
    }
    else {
      uVar9 = (ulong)('\0' < (char)(bVar6 << 5));
      node_02 = node_00->child[uVar9];
    }
    node_01 = node->parent;
    uVar10 = bVar6 >> 3 & 1;
    node_01->child[uVar10] = node_02;
    fix_child(node_01,uVar10);
    node->child[bVar2] = node_02->child[uVar9];
    fix_child(node,(uint)bVar2);
    node_02->child[uVar9] = node;
    uVar10 = (uint)('\0' < cVar7);
    fix_child(node_02,uVar10);
    if (bVar4 || cVar3 == '\0') {
      if ((node_00->field_0x20 & 7) == 0) {
        if (cVar11 < '\x01') {
          node->field_0x20 = node->field_0x20 | 7;
          node_00->field_0x20 = (node_00->field_0x20 & 0xf8) + 1;
        }
        else {
          node->field_0x20 = (node->field_0x20 & 0xf8) + 1;
          node_00->field_0x20 = node_00->field_0x20 | 7;
        }
      }
      else {
        node_00->field_0x20 = node_00->field_0x20 & 0xf8;
        node->field_0x20 = node->field_0x20 & 0xf8;
      }
    }
    else {
      node_00->child[uVar9] = node_02->child[bVar2];
      fix_child(node_00,uVar10);
      node_02->child[bVar2] = node_00;
      fix_child(node_02,(uint)bVar2);
      if (tree->upd != (vmd_bst_upd_t)0x0) {
        (*tree->upd)(node_00);
      }
      node->field_0x20 = node->field_0x20 & 0xf8;
      bVar6 = node_00->field_0x20 & 0xf8;
      node_00->field_0x20 = bVar6;
      cVar7 = node_02->field_0x20 * ' ';
      if (cVar7 != '\0') {
        bVar5 = -node_02->field_0x20;
        if ('\0' < cVar11 == cVar7 < ' ') {
          node_00->field_0x20 = bVar5 & 7 | bVar6;
        }
        else {
          node->field_0x20 = node->field_0x20 & 0xf8 | bVar5 & 7;
        }
        node_02->field_0x20 = node_02->field_0x20 & 0xf8;
      }
    }
    iVar8 = (int)((char)(cVar1 << 5) >> 5);
    update_to_top(tree,node);
  }
  return iVar8;
}

Assistant:

static int
rebalance(bst_t *tree, bst_node_t *node)
{
	if (node->balance >= -1 && node->balance <= 1)
		return 0;

	int dir = node->balance > 0;
	bst_node_t *c = node->child[!dir];
	int dbl = c->balance && ((node->balance > 0) != (c->balance > 0));
	bst_node_t *r = dbl ? c->child[dir] : c;

	/* rotation doesn't change the subtree height if c->balance == 0 */
	int ret = c->balance;

	set_child(node->parent, node->idx, r);
	set_child(node, !dir, r->child[dir]);
	set_child(r, dir, node);

	if (dbl) {
		set_child(c, dir, r->child[!dir]);
		set_child(r, !dir, c);

		if (tree->upd)
			tree->upd(c);

		node->balance = 0;
		c->balance = 0;
		if (r->balance) {
			if (dir == (r->balance > 0))
				node->balance = -(r->balance);
			else
				c->balance = -(r->balance);
			r->balance = 0;
		}
	} else {
		if (c->balance)
			node->balance = c->balance = 0;
		else if (dir) {
			node->balance = 1;
			c->balance = -1;
		} else {
			node->balance = -1;
			c->balance = 1;
		}
	}

	update_to_top(tree, node);

	return ret;
}